

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O0

int zt_ipv4_str2net(char *str,uint32_t *outaddr,int *outbitlen)

{
  in_addr_t __netlong;
  uint32_t uVar1;
  char *__s;
  char *__cp;
  char *pcVar2;
  int *in_RDX;
  uint32_t *in_RSI;
  char *in_RDI;
  int bitlen;
  char *cp;
  char *str_cp;
  char *save;
  int local_3c;
  int local_4;
  
  if (((in_RDI == (char *)0x0) || (in_RSI == (uint32_t *)0x0)) || (in_RDX == (int *)0x0)) {
    local_4 = -1;
  }
  else {
    __s = strdup(in_RDI);
    if (__s == (char *)0x0) {
      local_4 = -1;
    }
    else {
      __cp = (char *)calloc(0x10,1);
      if (__cp == (char *)0x0) {
        free(__s);
        local_4 = -1;
      }
      else {
        pcVar2 = strchr(__s,0x2f);
        if (pcVar2 == (char *)0x0) {
          local_3c = 0x20;
          *(undefined8 *)__cp = *(undefined8 *)in_RDI;
          *(undefined8 *)(__cp + 8) = *(undefined8 *)(in_RDI + 8);
        }
        else {
          local_3c = atoi(pcVar2 + 1);
          if (0xf < (long)pcVar2 - (long)__s) {
            free(__cp);
            free(__s);
            return -1;
          }
          memcpy(__cp,in_RDI,(long)pcVar2 - (long)__s);
        }
        if (0x20 < local_3c) {
          local_3c = 0x20;
        }
        __netlong = inet_addr(__cp);
        uVar1 = ntohl(__netlong);
        *in_RSI = uVar1;
        *in_RDX = local_3c;
        free(__cp);
        free(__s);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int
zt_ipv4_str2net(const char *str, uint32_t * outaddr, int *outbitlen)
{
    char *save;
    char *str_cp;
    char *cp;
    int   bitlen = 32;

    if (!str || !outaddr || !outbitlen) {
        return -1;
    }

    if (!(str_cp = strdup(str))) {
        return -1;
    }

    if (!(save = calloc(MAXLINE, 1))) {
        free(str_cp);
        return -1;
    }

    if ((cp = strchr(str_cp, '/')) != NULL) {
        bitlen = atoi(cp + 1);

        if ((cp - str_cp) > MAXLINE - 1) {
            free(save);
            free(str_cp);
            return -1;
        }

        memcpy(save, str, cp - str_cp);
    } else {
        bitlen = 32;
        memcpy(save, str, MAXLINE);
    }

    if (bitlen > 32) {
        bitlen = 32;
    }

    *outaddr = ntohl(inet_addr(save));
    *outbitlen = bitlen;

    free(save);
    free(str_cp);

    return 0;
}